

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O0

void __thiscall OpenMD::Sticky::addType(Sticky *this,AtomType *atomType)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar4;
  double *pdVar5;
  CubicSpline *this_01;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar6;
  reference pvVar7;
  reference pvVar8;
  AtomType *in_RSI;
  long in_RDI;
  RealType __new_size;
  RealType RVar9;
  vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_> *this_02;
  RealType RVar10;
  StickyAdapter *this_03;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar11;
  CubicSpline *sp;
  CubicSpline *s;
  StickyInteractionData mixer;
  StickyAdapter sticky2;
  AtomType *atype2;
  int stid2;
  iterator it;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int stid;
  int atid;
  StickyAdapter sticky1;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  CubicSpline *in_stack_fffffffffffffea0;
  CubicSpline *this_04;
  value_type_conflict1 *in_stack_fffffffffffffeb8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffec0;
  StickyAdapter *in_stack_fffffffffffffed0;
  RealType in_stack_fffffffffffffee8;
  int ident;
  uint in_stack_fffffffffffffef0;
  value_type vVar12;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  CubicSpline *local_98;
  set<int,_std::less<int>,_std::allocator<int>_> *local_90;
  undefined1 local_88;
  StickyAdapter local_80;
  AtomType *local_78;
  value_type local_6c;
  _Self local_68;
  _Base_ptr local_60;
  _Rb_tree_const_iterator<int> local_58;
  _Base_ptr local_50;
  undefined1 local_48;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_40;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_30;
  value_type local_20;
  uint local_1c;
  StickyAdapter local_18;
  AtomType *local_10;
  
  local_10 = in_RSI;
  StickyAdapter::StickyAdapter(&local_18,in_RSI);
  local_1c = AtomType::getIdent(local_10);
  sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2b9060);
  local_20 = (value_type)sVar2;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)in_stack_fffffffffffffea0);
  pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_50 = (_Base_ptr)pVar11.first._M_node;
  local_48 = pVar11.second;
  local_40.first._M_node = local_50;
  local_40.second = (bool)local_48;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_30,&local_40);
  if ((local_30.second & 1U) == 0) {
    snprintf(painCave.errMsg,2000,"Sticky already had a previous entry with ident %d\n",
             (ulong)local_1c);
    painCave.severity = 3;
    painCave.isFatal = 0;
    simError();
  }
  vVar12 = local_20;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)(int)local_1c);
  *pvVar3 = vVar12;
  std::
  vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                *)(in_RDI + 0x58),(long)local_20);
  std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::resize
            ((vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
              *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_58);
  local_60 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffe98);
  local_58._M_node = local_60;
  while( true ) {
    ident = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    local_68._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffe98);
    bVar1 = std::operator!=(&local_58,&local_68);
    if (!bVar1) break;
    this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x40);
    piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffea0);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*piVar4);
    local_6c = *pvVar3;
    this_04 = *(CubicSpline **)(in_RDI + 0x78);
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffea0);
    local_78 = ForceField::getAtomType
                         ((ForceField *)CONCAT44(vVar12,in_stack_fffffffffffffef0),ident);
    StickyAdapter::StickyAdapter(&local_80,local_78);
    __new_size = StickyAdapter::getRl(in_stack_fffffffffffffed0);
    RVar9 = StickyAdapter::getRl(in_stack_fffffffffffffed0);
    local_d8 = (__new_size + RVar9) * 0.5;
    this_02 = (vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
               *)StickyAdapter::getRu(in_stack_fffffffffffffed0);
    RVar9 = StickyAdapter::getRu(in_stack_fffffffffffffed0);
    local_d0 = ((double)this_02 + RVar9) * 0.5;
    RVar9 = StickyAdapter::getRlp(in_stack_fffffffffffffed0);
    RVar10 = StickyAdapter::getRlp(in_stack_fffffffffffffed0);
    local_c8 = (RVar9 + RVar10) * 0.5;
    in_stack_fffffffffffffed0 = (StickyAdapter *)StickyAdapter::getRup(in_stack_fffffffffffffed0);
    RVar9 = StickyAdapter::getRup(in_stack_fffffffffffffed0);
    local_c0 = ((double)in_stack_fffffffffffffed0 + RVar9) * 0.5;
    pdVar5 = std::max<double>(&local_d0,&local_c0);
    local_b8 = *pdVar5;
    this_03 = (StickyAdapter *)StickyAdapter::getW0(in_stack_fffffffffffffed0);
    RVar9 = StickyAdapter::getW0(in_stack_fffffffffffffed0);
    local_b0 = sqrt((double)this_03 * RVar9);
    RVar9 = StickyAdapter::getV0(in_stack_fffffffffffffed0);
    RVar10 = StickyAdapter::getV0(in_stack_fffffffffffffed0);
    local_a8 = sqrt(RVar9 * RVar10);
    in_stack_fffffffffffffee8 = StickyAdapter::getV0p(in_stack_fffffffffffffed0);
    RVar9 = StickyAdapter::getV0p(in_stack_fffffffffffffed0);
    local_a0 = sqrt(in_stack_fffffffffffffee8 * RVar9);
    bVar1 = StickyAdapter::isStickyPower(this_03);
    in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 & 0xffffff;
    if (bVar1) {
      bVar1 = StickyAdapter::isStickyPower(this_03);
      in_stack_fffffffffffffef0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef0);
    }
    local_88 = (undefined1)(in_stack_fffffffffffffef0 >> 0x18);
    this_01 = (CubicSpline *)operator_new(0xa0);
    CubicSpline::CubicSpline(this_01);
    in_stack_fffffffffffffea0 = this_01;
    CubicSpline::addPoint(this_04,(RealType)this_00,(RealType)this_01);
    CubicSpline::addPoint(this_04,(RealType)this_00,(RealType)in_stack_fffffffffffffea0);
    local_98 = this_01;
    psVar6 = (set<int,_std::less<int>,_std::allocator<int>_> *)operator_new(0xa0);
    CubicSpline::CubicSpline(in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe98 = psVar6;
    CubicSpline::addPoint(this_04,(RealType)this_00,(RealType)in_stack_fffffffffffffea0);
    CubicSpline::addPoint(this_04,(RealType)this_00,(RealType)in_stack_fffffffffffffea0);
    local_90 = psVar6;
    std::
    vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                  *)(in_RDI + 0x58),(long)local_6c);
    std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::
    resize(this_02,(size_type)__new_size);
    pvVar7 = std::
             vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                           *)(in_RDI + 0x58),(long)local_20);
    pvVar8 = std::
             vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::
             operator[](pvVar7,(long)local_6c);
    memcpy(pvVar8,&local_d8,0x58);
    if (local_6c != local_20) {
      pvVar7 = std::
               vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
               ::operator[]((vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                             *)(in_RDI + 0x58),(long)local_6c);
      pvVar8 = std::
               vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
               ::operator[](pvVar7,(long)local_20);
      memcpy(pvVar8,&local_d8,0x58);
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffea0);
  }
  return;
}

Assistant:

void Sticky::addType(AtomType* atomType) {
    StickyAdapter sticky1 = StickyAdapter(atomType);

    // add it to the map:

    int atid = atomType->getIdent();
    int stid = Stypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = Stypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Sticky already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    Stids[atid] = stid;
    MixingMap[stid].resize(nSticky_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = Stypes.begin(); it != Stypes.end(); ++it) {
      int stid2             = Stids[(*it)];
      AtomType* atype2      = forceField_->getAtomType((*it));
      StickyAdapter sticky2 = StickyAdapter(atype2);

      StickyInteractionData mixer;

      // Mixing two different sticky types is silly, but if you want 2
      // sticky types in your simulation, we'll let you do it with the
      // Lorentz- Berthelot mixing rules (which happen to do the right thing
      // when atomType and atype2 happen to be the same.

      mixer.rl      = 0.5 * (sticky1.getRl() + sticky2.getRl());
      mixer.ru      = 0.5 * (sticky1.getRu() + sticky2.getRu());
      mixer.rlp     = 0.5 * (sticky1.getRlp() + sticky2.getRlp());
      mixer.rup     = 0.5 * (sticky1.getRup() + sticky2.getRup());
      mixer.rbig    = max(mixer.ru, mixer.rup);
      mixer.w0      = sqrt(sticky1.getW0() * sticky2.getW0());
      mixer.v0      = sqrt(sticky1.getV0() * sticky2.getV0());
      mixer.v0p     = sqrt(sticky1.getV0p() * sticky2.getV0p());
      mixer.isPower = sticky1.isStickyPower() && sticky2.isStickyPower();

      CubicSpline* s = new CubicSpline();
      s->addPoint(mixer.rl, 1.0);
      s->addPoint(mixer.ru, 0.0);
      mixer.s = s;

      CubicSpline* sp = new CubicSpline();
      sp->addPoint(mixer.rlp, 1.0);
      sp->addPoint(mixer.rup, 0.0);
      mixer.sp = sp;

      MixingMap[stid2].resize(nSticky_);

      MixingMap[stid][stid2] = mixer;
      if (stid2 != stid) { MixingMap[stid2][stid] = mixer; }
    }
  }